

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printProblemStats.cpp
# Opt level: O2

string * toEnotation_abi_cxx11_(string *__return_storage_ptr__,LIndex nr)

{
  char *pcVar1;
  ostream *poVar2;
  string local_370 [32];
  string local_350 [32];
  stringstream ssE;
  ulong local_328;
  ostream local_320 [376];
  stringstream ss;
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&ssE);
  if (local_328 < 4) {
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ssE);
    std::__cxx11::stringbuf::str();
    pcVar1 = (char *)std::__cxx11::string::at((ulong)local_370);
    poVar2 = std::operator<<(local_320,*pcVar1);
    poVar2 = std::operator<<(poVar2,".");
    std::__cxx11::stringbuf::str();
    pcVar1 = (char *)std::__cxx11::string::at((ulong)local_350);
    std::operator<<(poVar2,*pcVar1);
    std::__cxx11::string::~string(local_350);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::stringbuf::str();
    pcVar1 = (char *)std::__cxx11::string::at((ulong)local_370);
    std::operator<<(local_320,*pcVar1);
    std::__cxx11::string::~string(local_370);
    poVar2 = std::operator<<(local_320,"e");
    std::__cxx11::stringbuf::str();
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ssE);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string toEnotation(LIndex nr)
{
    stringstream ss;
    ss << nr;
    if(ss.str().size()>3)
    {
        stringstream ssE;
        ssE << ss.str().at(0) << "." << ss.str().at(1);
        ssE << ss.str().at(2);
        ssE << "e" << ss.str().size()-1;
        return(ssE.str());
    } 
    else
        return(ss.str());
}